

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

void slang::ast::findIfaces
               (ClassType *type,SmallVectorBase<const_slang::ast::Type_*> *ifaces,
               SmallSet<const_slang::ast::Symbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>_>
               *visited)

{
  bool bVar1;
  Type *pTVar2;
  ClassType *type_00;
  long lVar3;
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>_>::templated_iterator<const_slang::ast::Symbol_*>,_bool>
  pVar4;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> sVar5;
  Type *iface;
  ClassType *local_48;
  SmallSet<const_slang::ast::Symbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>_>
  *local_40;
  ClassType *local_38;
  
  if (type->isInterface == true) {
    local_48 = type;
    pVar4 = ska::
            flat_hash_set<slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,std::equal_to<slang::ast::Symbol_const*>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>>
            ::emplace<slang::ast::ClassType_const*>
                      ((flat_hash_set<slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,std::equal_to<slang::ast::Symbol_const*>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>>
                        *)&visited->
                           super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>_>
                       ,&local_48);
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_48 = type;
      SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*>
                ((SmallVectorBase<slang::ast::Type_const*> *)ifaces,(Type **)&local_48);
    }
  }
  local_38 = type;
  sVar5 = ClassType::getImplementedInterfaces(type);
  local_40 = visited;
  for (lVar3 = 0; sVar5.size_ << 3 != lVar3; lVar3 = lVar3 + 8) {
    local_48 = *(ClassType **)((long)sVar5.data_ + lVar3);
    pVar4 = ska::
            flat_hash_set<slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,std::equal_to<slang::ast::Symbol_const*>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>>
            ::emplace<slang::ast::Type_const*&>
                      ((flat_hash_set<slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,std::equal_to<slang::ast::Symbol_const*>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>>
                        *)&visited->
                           super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>_>
                       ,(Type **)&local_48);
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*const&>
                ((SmallVectorBase<slang::ast::Type_const*> *)ifaces,(Type **)&local_48);
    }
  }
  pTVar2 = ClassType::getBaseClass(local_38);
  if (pTVar2 != (Type *)0x0) {
    bVar1 = Type::isError(pTVar2);
    if (!bVar1) {
      pTVar2 = Type::getCanonicalType(pTVar2);
      type_00 = Symbol::as<slang::ast::ClassType>(&pTVar2->super_Symbol);
      findIfaces(type_00,ifaces,local_40);
    }
  }
  return;
}

Assistant:

static void findIfaces(const ClassType& type, SmallVectorBase<const Type*>& ifaces,
                       SmallSet<const Symbol*, 4>& visited) {
    if (type.isInterface) {
        if (visited.emplace(&type).second)
            ifaces.push_back(&type);
    }

    for (auto iface : type.getImplementedInterfaces()) {
        if (visited.emplace(iface).second)
            ifaces.push_back(iface);
    }

    if (auto base = type.getBaseClass(); base && !base->isError())
        findIfaces(base->getCanonicalType().as<ClassType>(), ifaces, visited);
}